

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.hpp
# Opt level: O1

mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
* effolkronium::
  basic_random_local<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_effolkronium::seeder_default,_std::uniform_int_distribution,_std::uniform_real_distribution,_std::bernoulli_distribution>
  ::make_seeded_engine(void)

{
  uint uVar1;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_RDI;
  initializer_list<unsigned_long> __il;
  seed_seq local_13c8;
  ulong local_13a8;
  undefined8 local_13a0;
  random_device local_1398;
  
  local_13c8._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_13c8._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_13c8._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::random_device::random_device(&local_1398);
  uVar1 = std::random_device::_M_getval();
  local_13a8 = (ulong)uVar1;
  local_13a0 = std::chrono::_V2::steady_clock::now();
  __il._M_len = 2;
  __il._M_array = &local_13a8;
  std::seed_seq::seed_seq<unsigned_long,void>(&local_13c8,__il);
  std::random_device::_M_fini();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed<std::seed_seq>(in_RDI,&local_13c8);
  if (local_13c8._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_13c8._M_v.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return in_RDI;
}

Assistant:

static Engine make_seeded_engine( ) {
            // Make seeder instance for seed return by reference like std::seed_seq
            return Engine{ Seeder{ }( ) };
        }